

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O3

void __thiscall
deqp::gls::ShaderExecUtil::BufferIoExecutor::initBuffers(BufferIoExecutor *this,int numValues)

{
  pointer pVVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  
  pVVar1 = (this->m_inputLayout).
           super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar3 = 0;
  dVar2 = 0;
  if (pVVar1 != (this->m_inputLayout).
                super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    dVar2 = pVVar1->stride;
  }
  pVVar1 = (this->m_outputLayout).
           super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (this->m_outputLayout).
                super__Vector_base<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout,_std::allocator<deqp::gls::ShaderExecUtil::BufferIoExecutor::VarLayout>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    dVar3 = pVVar1->stride;
  }
  resizeInputBuffer(this,dVar2 * numValues);
  resizeOutputBuffer(this,dVar3 * numValues);
  return;
}

Assistant:

void BufferIoExecutor::initBuffers (int numValues)
{
	const deUint32		inputStride			= getLayoutStride(m_inputLayout);
	const deUint32		outputStride		= getLayoutStride(m_outputLayout);
	const int			inputBufferSize		= numValues * inputStride;
	const int			outputBufferSize	= numValues * outputStride;

	resizeInputBuffer(inputBufferSize);
	resizeOutputBuffer(outputBufferSize);
}